

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this)

{
  UBool UVar1;
  UChar32 *pUVar2;
  UErrorCode local_14;
  UnicodeSet *pUStack_10;
  UErrorCode status;
  UnicodeSet *this_local;
  
  pUStack_10 = this;
  UnicodeFilter::UnicodeFilter(&this->super_UnicodeFilter);
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_004a90e0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_004a91f8;
  this->len = 1;
  this->capacity = 0x11;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  this->stringSpan = (UnicodeSetStringSpan *)0x0;
  this->fFlags = '\0';
  local_14 = U_ZERO_ERROR;
  allocateStrings(this,&local_14);
  UVar1 = ::U_FAILURE(local_14);
  if (UVar1 == '\0') {
    pUVar2 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar2;
    if (this->list == (UChar32 *)0x0) {
      setToBogus(this);
    }
    else {
      *this->list = 0x110000;
    }
  }
  else {
    setToBogus(this);
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet() :
    len(1), capacity(1 + START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        list[0] = UNICODESET_HIGH;
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}